

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall
BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage(BayesianGameForDecPOMDPStage *this)

{
  bool bVar1;
  reference ppJVar2;
  __normal_iterator<JointBeliefInterface_**,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
  *in_RDI;
  iterator last;
  iterator it;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_stack_ffffffffffffffc8
  ;
  JointBeliefInterface *in_stack_ffffffffffffffd0;
  __normal_iterator<JointBeliefInterface_**,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
  in_stack_ffffffffffffffe0;
  __normal_iterator<JointBeliefInterface_**,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
  local_10 [2];
  
  in_RDI->_M_current = (JointBeliefInterface **)&PTR__BayesianGameForDecPOMDPStage_00d06940;
  in_RDI[4]._M_current = (JointBeliefInterface **)&PTR__BayesianGameForDecPOMDPStage_00d06990;
  local_10[0]._M_current =
       (JointBeliefInterface **)
       std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<JointBeliefInterface_**,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<JointBeliefInterface_**,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppJVar2 = __gnu_cxx::
              __normal_iterator<JointBeliefInterface_**,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 = *ppJVar2;
    if (in_stack_ffffffffffffffd0 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*in_stack_ffffffffffffffd0 + 8))();
    }
    in_stack_ffffffffffffffe0 =
         __gnu_cxx::
         __normal_iterator<JointBeliefInterface_**,_std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>
         ::operator++(in_RDI,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffffe0._M_current);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::~vector
            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
             in_stack_ffffffffffffffe0._M_current);
  BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff
            ((BayesianGameIdenticalPayoff *)in_stack_ffffffffffffffe0._M_current);
  BayesianGameForDecPOMDPStageInterface::~BayesianGameForDecPOMDPStageInterface
            ((BayesianGameForDecPOMDPStageInterface *)0x8b656c);
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage()
{
    //free all the joint beliefs:
    std::vector< JointBeliefInterface* >::iterator it =  _m_JBs.begin();
    std::vector< JointBeliefInterface* >::iterator last =  _m_JBs.end();
    while(it != last)
    {
        delete *it;
        it++;
    }
}